

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

float Scl_LibertyReadPinCap(Scl_Tree_t *p,Scl_Item_t *pPin,char *pName)

{
  int iVar1;
  char *__nptr;
  double dVar2;
  Scl_Item_t *local_30;
  Scl_Item_t *pItem;
  char *pName_local;
  Scl_Item_t *pPin_local;
  Scl_Tree_t *p_local;
  
  local_30 = Scl_LibertyItem(p,pPin->Child);
  while( true ) {
    if (local_30 == (Scl_Item_t *)0x0) {
      return 0.0;
    }
    iVar1 = Scl_LibertyCompare(p,local_30->Key,pName);
    if (iVar1 == 0) break;
    local_30 = Scl_LibertyItem(p,local_30->Next);
  }
  __nptr = Scl_LibertyReadString(p,local_30->Head);
  dVar2 = atof(__nptr);
  return (float)dVar2;
}

Assistant:

float Scl_LibertyReadPinCap( Scl_Tree_t * p, Scl_Item_t * pPin, char * pName )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, pPin, pItem, pName )
        return atof(Scl_LibertyReadString(p, pItem->Head));
    return 0;
}